

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::directory_iterator::impl::~impl(impl *this)

{
  directory_entry *in_RDI;
  
  if (in_RDI->_symlink_status != (file_status)0x0) {
    closedir((DIR *)in_RDI->_symlink_status);
  }
  directory_entry::~directory_entry(in_RDI);
  path::~path((path *)0x1e4494);
  return;
}

Assistant:

~impl()
    {
        if (_dir) {
            ::closedir(_dir);
        }
    }